

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStringObject::SetProperty
          (JavascriptStringObject *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyId propertyId;
  BOOL BVar2;
  ScriptContext *this_00;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *pPStack_38;
  bool result;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptString *propertyNameString_local;
  JavascriptStringObject *this_local;
  
  pPStack_38 = info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local = propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::FindPropertyRecord(this_00,(JavascriptString *)value_local,&local_48);
  if (local_48 != (PropertyRecord *)0x0) {
    propertyId = PropertyRecord::GetPropertyId(local_48);
    bVar1 = SetPropertyBuiltIns(this,propertyId,info_local._4_4_,(bool *)((long)&propertyRecord + 7)
                               );
    if (bVar1) {
      return (uint)(propertyRecord._7_1_ & 1);
    }
  }
  BVar2 = DynamicObject::SetProperty
                    (&this->super_DynamicObject,(JavascriptString *)value_local,pvStack_28,
                     info_local._4_4_,pPStack_38);
  return BVar2;
}

Assistant:

BOOL JavascriptStringObject::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        bool result;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && SetPropertyBuiltIns(propertyRecord->GetPropertyId(), flags, &result))
        {
            return result;
        }
        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    }